

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_luma_subsampling_422_lbd_ssse3
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  
  auVar3 = _DAT_004bd930;
  auVar2 = _DAT_004bd920;
  auVar1 = _DAT_00469a90;
  pauVar4 = (undefined1 (*) [16])(pred_buf_q3 + (ulong)(uint)(height << 2) * 8);
  do {
    if (width == 8) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)*(undefined1 (*) [16])input;
      auVar5 = pmaddubsw(auVar5,auVar2);
      *(long *)*(undefined1 (*) [16])pred_buf_q3 = auVar5._0_8_;
    }
    else if (width == 4) {
      auVar5 = pmaddubsw(ZEXT416(*(uint *)*(undefined1 (*) [16])input),auVar3);
      *(int *)*(undefined1 (*) [16])pred_buf_q3 = auVar5._0_4_;
    }
    else {
      auVar5 = pmaddubsw(*(undefined1 (*) [16])input,auVar1);
      *(undefined1 (*) [16])pred_buf_q3 = auVar5;
      if (width == 0x20) {
        auVar5 = pmaddubsw(*(undefined1 (*) [16])((long)input + 0x10),auVar1);
        *(undefined1 (*) [16])((long)pred_buf_q3 + 0x10) = auVar5;
      }
    }
    input = *(undefined1 (*) [16])input + input_stride;
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
  } while (pred_buf_q3 < pauVar4);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_422_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i fours = _mm_set1_epi8(4);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + height * CFL_BUF_LINE_I128;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, fours);
      _mm_storeh_epi32(pred_buf_m128i, top);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, fours);
      _mm_storel_epi64(pred_buf_m128i, top);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, fours);
      _mm_storeu_si128(pred_buf_m128i, top);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        top_1 = _mm_maddubs_epi16(top_1, fours);
        _mm_storeu_si128(pred_buf_m128i + 1, top_1);
      }
    }
    input += input_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}